

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::base::PeriodicTask::~PeriodicTask(PeriodicTask *this)

{
  PeriodicTask *this_local;
  
  Reset(this);
  WeakPtrFactory<perfetto::base::PeriodicTask>::~WeakPtrFactory(&this->weak_ptr_factory_);
  ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
  ::~ScopedResource(&this->timer_fd_);
  Args::~Args(&this->args_);
  return;
}

Assistant:

PeriodicTask::~PeriodicTask() {
  Reset();
}